

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

String __thiscall Bstrlib::String::extractToken(String *this,char c,int *pos)

{
  uint len;
  uint uVar1;
  uint uVar2;
  uint *in_RCX;
  uchar *puVar3;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uint uVar4;
  undefined7 in_register_00000031;
  long lVar5;
  String SVar6;
  String local_40;
  
  lVar5 = CONCAT71(in_register_00000031,c);
  String(this);
  len = *in_RCX;
  puVar3 = (uchar *)(ulong)len;
  uVar1 = *(uint *)(lVar5 + 4);
  if ((int)len < (int)uVar1) {
    uVar2 = 0xffffffff;
    if (-1 < (int)len) {
      puVar3 = puVar3 + *(long *)(lVar5 + 8);
      uVar4 = len;
      do {
        uVar2 = uVar4;
        if (*puVar3 == (uchar)pos) break;
        uVar4 = uVar4 + 1;
        puVar3 = puVar3 + 1;
        uVar2 = 0xffffffff;
      } while ((int)uVar4 < (int)uVar1);
    }
    if (uVar2 != 0xffffffff) {
      uVar1 = uVar2;
    }
    midString(&local_40,(int)lVar5,len);
    operator=(this,&local_40);
    puVar3 = extraout_RDX;
    if (local_40.super_tagbstring.data != (uchar *)0x0) {
      free(local_40.super_tagbstring.data);
      puVar3 = extraout_RDX_00;
    }
    *in_RCX = uVar1 + 1;
  }
  SVar6.super_tagbstring.data = puVar3;
  SVar6.super_tagbstring._0_8_ = this;
  return (String)SVar6.super_tagbstring;
}

Assistant:

String String::extractToken(char c, int & pos) const
    {
        String ret;
        if (pos >= slen) return ret;

        int findNextPos = Find(c, pos);
        if (findNextPos == -1) findNextPos = slen;
        ret = midString(pos, findNextPos - pos);
        pos = findNextPos + 1;
        return ret;
    }